

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O1

bool __thiscall RTIMUGD20HM303D::IMUInit(RTIMUGD20HM303D *this)

{
  RTIMUSettings *this_00;
  bool bVar1;
  uchar uVar2;
  char *__format;
  uchar result;
  uchar local_9;
  
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  this_00 = (this->super_RTIMU).m_settings;
  this->m_gyroSlaveAddr = this_00->m_I2CSlaveAddress;
  bVar1 = RTIMUHal::HALRead(&this_00->super_RTIMUHal,'\x1e','\x0f','\x01',&local_9,"");
  uVar2 = '\x1d';
  if ((!bVar1) || (uVar2 = '\x1e', local_9 == 'I')) {
    this->m_accelCompassSlaveAddr = uVar2;
  }
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if ((((bVar1) &&
       (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_gyroSlaveAddr,'9','\x04',"Failed to reset L3GD20H"),
       bVar1)) &&
      (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_gyroSlaveAddr,'$',0x80,"Failed to boot L3GD20H"), bVar1))
     && (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_gyroSlaveAddr,'\x0f','\x01',&local_9,
                                   "Failed to read L3GD20H id"), bVar1)) {
    if (local_9 != 0xd7) {
      __format = "Incorrect L3GD20H id %d\n";
LAB_00119922:
      fprintf(_stderr,__format);
      return false;
    }
    bVar1 = setGyroSampleRate(this);
    if (((bVar1) && (bVar1 = setGyroCTRL2(this), bVar1)) &&
       ((bVar1 = setGyroCTRL4(this), bVar1 &&
        (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_accelCompassSlaveAddr,'\x0f','\x01',&local_9,
                                   "Failed to read LSM303D id"), bVar1)))) {
      if (local_9 != 'I') {
        __format = "Incorrect LSM303D id %d\n";
        goto LAB_00119922;
      }
      bVar1 = setAccelCTRL1(this);
      if (((bVar1) && (bVar1 = setAccelCTRL2(this), bVar1)) &&
         ((bVar1 = setCompassCTRL5(this), bVar1 &&
          (((bVar1 = setCompassCTRL6(this), bVar1 &&
            (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                        this->m_accelCompassSlaveAddr,'&','`',
                                        "Failed to set LSM303D CTRL7"), bVar1)) &&
           (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_gyroSlaveAddr,'$','\x10',
                                       "Failed to set L3GD20H CTRL5"), bVar1)))))) {
        RTIMU::gyroBiasInit(&this->super_RTIMU);
        puts("GD20HM303D init complete");
        fflush(_stdout);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUGD20HM303D::IMUInit()
{
    unsigned char result;

#ifdef GD20HM303D_CACHE_MODE
    m_firstTime = true;
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif
    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_gyroSlaveAddr = m_settings->m_I2CSlaveAddress;

    // work out accel/mag address

    if (m_settings->HALRead(LSM303D_ADDRESS0, LSM303D_WHO_AM_I, 1, &result, "")) {
        if (result == LSM303D_ID) {
            m_accelCompassSlaveAddr = LSM303D_ADDRESS0;
        }
    } else {
        m_accelCompassSlaveAddr = LSM303D_ADDRESS1;
    }

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  Set up the gyro

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_LOW_ODR, 0x04, "Failed to reset L3GD20H"))
        return false;

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_CTRL5, 0x80, "Failed to boot L3GD20H"))
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, L3GD20H_WHO_AM_I, 1, &result, "Failed to read L3GD20H id"))
        return false;

    if (result != L3GD20H_ID) {
        HAL_ERROR1("Incorrect L3GD20H id %d\n", result);
        return false;
    }

    if (!setGyroSampleRate())
            return false;

    if (!setGyroCTRL2())
            return false;

    if (!setGyroCTRL4())
            return false;

    //  Set up the accel/compass

    if (!m_settings->HALRead(m_accelCompassSlaveAddr, LSM303D_WHO_AM_I, 1, &result, "Failed to read LSM303D id"))
        return false;

    if (result != LSM303D_ID) {
        HAL_ERROR1("Incorrect LSM303D id %d\n", result);
        return false;
    }

    if (!setAccelCTRL1())
        return false;

    if (!setAccelCTRL2())
        return false;

    if (!setCompassCTRL5())
        return false;

    if (!setCompassCTRL6())
        return false;

    if (!setCompassCTRL7())
        return false;

#ifdef GD20HM303D_CACHE_MODE

    //  turn on gyro fifo

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_FIFO_CTRL, 0x3f, "Failed to set L3GD20H FIFO mode"))
        return false;
#endif

    if (!setGyroCTRL5())
            return false;

    gyroBiasInit();

    HAL_INFO("GD20HM303D init complete\n");
    return true;
}